

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall ParseTest_ParseLine_Test::ParseTest_ParseLine_Test(ParseTest_ParseLine_Test *this)

{
  ParseTest::ParseTest(&this->super_ParseTest);
  (this->super_ParseTest).super_Test._vptr_Test = (_func_int **)&PTR__ParseTest_00135080;
  return;
}

Assistant:

TEST_F(ParseTest, ParseLine) {
    test_parse_line(&_parse);
}